

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall wasm::LocalScanner::visitLocalSet(LocalScanner *this,LocalSet *curr)

{
  uint uVar1;
  Module *module;
  PassOptions *passOptions;
  pointer pLVar2;
  BinaryOp BVar3;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> pBVar4;
  bool bVar5;
  Id IVar6;
  uint uVar7;
  Index IVar8;
  Type TVar9;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> candidate;
  Expression **ppEVar10;
  Expression *pEVar11;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_128;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_e8;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_c0;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_b0;
  undefined8 local_70;
  undefined4 local_68;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_60;
  Expression *local_48;
  Expression *extended;
  int local_38;
  int local_34;
  int32_t leftShift;
  int32_t rightShift;
  
  bVar5 = Function::isParam((this->
                            super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                            ).
                            super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                            .currFunction,curr->index);
  if (bVar5) {
    return;
  }
  TVar9 = Function::getLocalType
                    ((this->
                     super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>)
                     .super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                     currFunction,curr->index);
  if ((TVar9.id & 0xfffffffffffffffe) != 2) {
    return;
  }
  module = (this->super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>).
           super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currModule;
  passOptions = this->passOptions;
  pBVar4 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
           curr->value;
  extended = (Expression *)curr;
  do {
    candidate = pBVar4;
    local_b0.binder = (matched_t<wasm::Const_*> *)candidate;
    ppEVar10 = Properties::getImmediateFallthroughPtr
                         ((Expression **)&local_b0,passOptions,module,AllowTeeBrIf);
    pBVar4 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
             *ppEVar10;
  } while ((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
           *ppEVar10 != candidate);
  uVar1 = *(uint *)(extended + 1);
  pLVar2 = (this->localInfo->super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = Bits::getMaxBits<wasm::LocalScanner>((Expression *)candidate,this);
  if (uVar7 < pLVar2[uVar1].maxBits) {
    uVar7 = pLVar2[uVar1].maxBits;
  }
  pLVar2[uVar1].maxBits = uVar7;
  IVar6 = (candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
  if ((candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id == 2)
  {
    if (IVar6 == UnaryId) {
      IVar8 = 0xffffffff;
      if (1 < candidate->op - GtUInt64) goto LAB_009ea49e;
      pEVar11 = candidate->left;
    }
    else {
      local_b0.submatchers.curr.submatchers.curr.binder = &local_38;
      local_38 = 0;
      local_128.submatchers.curr.submatchers.curr.binder = &local_34;
      local_34 = 0;
      local_c0.binder = &local_48;
      local_48 = (Expression *)0x0;
      local_e8.submatchers.curr = &local_c0;
      local_b0.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_b0.binder = (matched_t<wasm::Const_*> *)0x0;
      local_60.curr = &local_e8;
      local_e8.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
      local_e8.data = ShlInt32;
      local_60.next.curr = &local_128;
      local_128.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
      local_128.binder = (matched_t<wasm::Const_*> *)0x0;
      local_70 = 0;
      local_68 = 0xb;
      local_e8.submatchers.next.curr = &local_b0;
      if ((((IVar6 != BinaryId) || (candidate->op != ShrSInt32)) ||
          (bVar5 = Match::Internal::
                   Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                   ::match(candidate,&local_60), !bVar5)) ||
         ((local_38 != local_34 || (pEVar11 = local_48, local_38 == 0)))) {
        pEVar11 = (Expression *)0x0;
      }
    }
    if (pEVar11 != (Expression *)0x0) {
      IVar8 = Properties::getSignExtBits((Expression *)candidate);
      goto LAB_009ea49e;
    }
    IVar6 = (candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
  }
  IVar8 = 0xffffffff;
  if ((((IVar6 == LoadId) &&
       ((local_b0.binder =
              (matched_t<wasm::Const_*> *)
              (candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.
              id, (matched_t<wasm::Const_*> *)0x5 < local_b0.binder ||
        ((0x32UL >> ((ulong)local_b0.binder & 0x3f) & 1) == 0)))) &&
      (BVar3 = candidate->op, uVar7 = wasm::Type::getByteSize((Type *)&local_b0),
      (byte)(char)BVar3 < uVar7)) && (*(byte *)((long)&candidate->op + 1) == 1)) {
    IVar8 = (uint)(byte)(char)candidate->op << 3;
  }
LAB_009ea49e:
  if ((pLVar2[uVar1].signExtBits == 0) ||
     (bVar5 = pLVar2[uVar1].signExtBits != IVar8, IVar8 = 0xffffffff, bVar5)) {
    pLVar2[uVar1].signExtBits = IVar8;
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    auto* func = getFunction();
    if (func->isParam(curr->index)) {
      return;
    }
    auto type = getFunction()->getLocalType(curr->index);
    if (type != Type::i32 && type != Type::i64) {
      return;
    }
    // an integer var, worth processing
    auto* value =
      Properties::getFallthrough(curr->value, passOptions, *getModule());
    auto& info = localInfo[curr->index];
    info.maxBits = std::max(info.maxBits, Bits::getMaxBits(value, this));
    auto signExtBits = LocalInfo::kUnknown;
    if (Properties::getSignExtValue(value)) {
      signExtBits = Properties::getSignExtBits(value);
    } else if (auto* load = value->dynCast<Load>()) {
      if (LoadUtils::isSignRelevant(load) && load->signed_) {
        signExtBits = load->bytes * 8;
      }
    }
    if (info.signExtBits == 0) {
      info.signExtBits = signExtBits; // first info we see
    } else if (info.signExtBits != signExtBits) {
      // contradictory information, give up
      info.signExtBits = LocalInfo::kUnknown;
    }
  }